

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O3

char * apprun_env_str_entry_extract_value(char *string)

{
  size_t sVar1;
  char *pcVar2;
  
  if (string != (char *)0x0) {
    sVar1 = strlen(string);
    if (sVar1 != 0) {
      pcVar2 = strchr(string,0x3d);
      if (((ulong)(string + (sVar1 - (long)pcVar2)) & 0xfffffffe) != 0) {
        pcVar2 = strndup(pcVar2 + 1,(ulong)(string + (sVar1 - (long)pcVar2)) & 0xffffffff);
        return pcVar2;
      }
    }
  }
  return (char *)0x0;
}

Assistant:

char *apprun_env_str_entry_extract_value(char *string) {
    if (string && strlen(string) > 0) {
        unsigned string_len = strlen(string);
        char *sep = strchr(string, '=');
        unsigned value_len = string_len - (sep - string);

        // assume empty string value as NULL
        if (value_len > 1)
            return strndup(sep + 1, value_len);
    }

    return NULL;
}